

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmobj.cpp
# Opt level: O0

void __thiscall CVmObjFixup::fix_vmb_obj(CVmObjFixup *this,char *p)

{
  undefined8 in_RSI;
  vm_obj_id_t old_id;
  CVmObjFixup *in_RDI;
  vm_obj_id_t id;
  vm_obj_id_t in_stack_ffffffffffffffdc;
  CVmObjFixup *this_00;
  
  old_id = (vm_obj_id_t)((ulong)in_RSI >> 0x20);
  this_00 = in_RDI;
  vmb_get_objid((char *)0x377ba2);
  get_new_id(this_00,old_id);
  vmb_put_objid((char *)in_RDI,in_stack_ffffffffffffffdc);
  return;
}

Assistant:

void CVmObjFixup::fix_vmb_obj(VMG_ char *p)
{
    vm_obj_id_t id;

    /* get the old ID */
    id = vmb_get_objid(p);

    /* fix it up */
    id = get_new_id(vmg_ id);

    /* store it back */
    vmb_put_objid(p, id);
}